

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  FILE *__stream;
  char *pcVar1;
  allocator local_11;
  
  pcVar1 = "";
  if (premature_exit_filepath != (char *)0x0) {
    pcVar1 = premature_exit_filepath;
  }
  std::__cxx11::string::string((string *)this,pcVar1,&local_11);
  if ((this->premature_exit_filepath_)._M_string_length != 0) {
    __stream = fopen(premature_exit_filepath,"w");
    fputc(0x30,__stream);
    fclose(__stream);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(premature_exit_filepath ?
                                 premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath, "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }